

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h)

{
  Clipboard_Notify **ppCVar1;
  Clipboard_Notify *pCVar2;
  Clipboard_Notify *pCVar3;
  
  if (clip_notify_list == (Clipboard_Notify *)0x0) {
    return;
  }
  pCVar3 = clip_notify_list;
  if (clip_notify_list->handler == h) {
    ppCVar1 = &clip_notify_list;
  }
  else {
    do {
      pCVar2 = pCVar3;
      pCVar3 = pCVar2->next;
      if (pCVar3 == (Clipboard_Notify *)0x0) {
        return;
      }
    } while (pCVar3->handler != h);
    ppCVar1 = &pCVar2->next;
  }
  *ppCVar1 = pCVar3->next;
  operator_delete(pCVar3,0x18);
  fl_clipboard_notify_change();
  return;
}

Assistant:

void Fl::remove_clipboard_notify(Fl_Clipboard_Notify_Handler h) {
  struct Clipboard_Notify *node, **prev;

  node = clip_notify_list;
  prev = &clip_notify_list;
  while (node != NULL) {
    if (node->handler == h) {
      *prev = node->next;
      delete node;

      fl_clipboard_notify_change();

      return;
    }

    prev = &node->next;
    node = node->next;
  }
}